

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  bool bVar1;
  int iVar2;
  reference pbVar3;
  pointer pbVar4;
  ostream *poVar5;
  char *pathname;
  int local_4c4;
  int i;
  long time_base;
  char r_buf [1024];
  _Self local_a8;
  int local_9c;
  long lStack_98;
  int success_num;
  size_type idx;
  string local_88 [8];
  string b;
  allocator local_51;
  string local_50 [8];
  string serial_port;
  _Self local_30;
  iterator it;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  l;
  
  getComList_abi_cxx11_();
  local_30._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&it);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_50,"",&local_51);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88,"USB",(allocator *)((long)&idx + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&idx + 7));
  local_9c = 0;
  while( true ) {
    local_a8._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&it);
    bVar1 = std::operator!=(&local_30,&local_a8);
    if (!bVar1) break;
    pbVar3 = std::
             _List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&local_30);
    poVar5 = std::operator<<((ostream *)&std::cout,(string *)pbVar3);
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    pbVar4 = std::
             _List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator->(&local_30);
    lStack_98 = std::__cxx11::string::find((string *)pbVar4,(ulong)local_88);
    if (lStack_98 != -1) {
      std::operator<<((ostream *)&std::cout,"found\n");
      local_9c = local_9c + 1;
      pbVar3 = std::
               _List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&local_30);
      std::__cxx11::string::operator=(local_50,(string *)pbVar3);
    }
    std::
    _List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&local_30,0);
  }
  if (local_9c == 1) {
    poVar5 = std::operator<<((ostream *)&std::cout,"find serial port, OK!!!");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    poVar5 = std::operator<<((ostream *)&std::cout,"serial_port == ");
    poVar5 = std::operator<<(poVar5,local_50);
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  }
  if (1 < local_9c) {
    poVar5 = std::operator<<((ostream *)&std::cout,
                             "find more than one serial port,please choose check!!!");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  }
  if (local_9c < 1) {
    poVar5 = std::operator<<((ostream *)&std::cout,"not found right serial port,please check!!!");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  }
  bzero(&time_base,0x400);
  iVar2 = IMU_JY61::fd;
  pathname = (char *)std::__cxx11::string::c_str();
  IMU_JY61::fd = IMU_JY61::uart_open(iVar2,pathname);
  if (IMU_JY61::fd == -1) {
    fprintf(_stderr,"uart_open error\n");
    exit(1);
  }
  iVar2 = IMU_JY61::uart_set(IMU_JY61::fd,0x1c200,8,'N',1);
  if (iVar2 == -1) {
    fprintf(_stderr,"uart set failed!\n");
    exit(1);
  }
  IMU_JY61::getTime();
  while( true ) {
    IMU_JY61::ret = IMU_JY61::recv_data(IMU_JY61::fd,(char *)&time_base,0x2c);
    if (IMU_JY61::ret == -1) break;
    for (local_4c4 = 0; local_4c4 < IMU_JY61::ret; local_4c4 = local_4c4 + 1) {
      IMU_JY61::ParseData(r_buf[(long)local_4c4 + -8]);
    }
    usleep(1000);
  }
  fprintf(_stderr,"uart read failed!\n");
  exit(1);
}

Assistant:

int main(void)
{
    //qxiaofan added
    //自动识别串口
    list<string> l = getComList();

    list<string>::iterator it = l.begin();

    std::string serial_port= "";
    std::string b = "USB";
    string::size_type idx;

    int success_num = 0;

    while (it != l.end()) {
        cout << *it << endl;

        idx = it->find(b);
        if(idx != string::npos)
        {
            cout<<"found\n";
            success_num++;
            serial_port = *it;
        }
        it++;
    }

    if(success_num == 1)
    {
        std::cout<<"find serial port, OK!!!"<<std::endl;
        std::cout<<"serial_port == "<<serial_port<<std::endl;
    }

    if(success_num > 1)
    {
        std::cout<<"find more than one serial port,please choose check!!!"<<std::endl;
    }

    if(success_num < 1)
    {
        std::cout<<"not found right serial port,please check!!!"<<std::endl;
    }
    //qxiaofan ended

    char r_buf[1024];
    bzero(r_buf,1024);

    //src
    //fd = uart_open(fd,"/dev/ttyUSB1");/*串口号/dev/ttySn,USB口号/dev/ttyUSBn */

    fd = uart_open(fd,serial_port.c_str());

    if(fd == -1)
    {
        fprintf(stderr,"uart_open error\n");
        exit(EXIT_FAILURE);
    }

    if(uart_set(fd,BAUD,8,'N',1) == -1)
    {
        fprintf(stderr,"uart set failed!\n");
        exit(EXIT_FAILURE);
    }

    //src
	//FILE *fp;
	//fp = fopen("Record.txt","w");

	long time_base = getTime();
    while(1)
    {
        ret = recv_data(fd,r_buf,44);
        if(ret == -1)
        {
            fprintf(stderr,"uart read failed!\n");
            exit(EXIT_FAILURE);
        }
		for (int i=0;i<ret;i++) {
		    //fprintf(fp,"%2X ",r_buf[i]);
		    //std::cout<<"r_buf["<<i<<"] == "<<r_buf[i]<<std::endl;
		    ParseData(r_buf[i]);
		}
        usleep(1000);
    }

    ret = uart_close(fd);
    if(ret == -1)
    {
        fprintf(stderr,"uart_close error\n");
        exit(EXIT_FAILURE);
    }

    exit(EXIT_SUCCESS);
}